

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O2

ztast_assignment_t * ztast_assignment(ztast_t *ast,ztast_id_t *id,ztast_expr_t *expr)

{
  ztast_assignment_t *pzVar1;
  
  pzVar1 = (ztast_assignment_t *)(*ast->mallocfn)(0x10,ast->opaque);
  if (pzVar1 != (ztast_assignment_t *)0x0) {
    pzVar1->id = id;
    pzVar1->expr = expr;
  }
  return pzVar1;
}

Assistant:

ztast_assignment_t *ztast_assignment(ztast_t      *ast,
                                     ztast_id_t   *id,
                                     ztast_expr_t *expr)
{
  ztast_assignment_t *ass;

  assert(ast);
  assert(id);
  assert(expr);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_assignment\n");
#endif

  ass = ZTAST_MALLOC(sizeof(*ass));
  if (ass == NULL)
    return NULL;

  ass->id   = id;
  ass->expr = expr;

  return ass;
}